

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMocker<const_solitaire::interfaces::Button_&()>::
UntypedDescribeUninterestingCall
          (FunctionMocker<const_solitaire::interfaces::Button_&()> *this,void *untyped_args,
          ostream *os)

{
  ostream *poVar1;
  char *pcVar2;
  ArgumentTuple *args;
  ostream *os_local;
  void *untyped_args_local;
  FunctionMocker<const_solitaire::interfaces::Button_&()> *this_local;
  
  std::operator<<(os,"Uninteresting mock function call - ");
  DescribeDefaultActionTo(this,(ArgumentTuple *)untyped_args,os);
  poVar1 = std::operator<<(os,"    Function call: ");
  pcVar2 = UntypedFunctionMockerBase::Name(&this->super_UntypedFunctionMockerBase);
  std::operator<<(poVar1,pcVar2);
  UniversalPrint<std::tuple<>>((tuple<> *)untyped_args,os);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    *os << "Uninteresting mock function call - ";
    DescribeDefaultActionTo(args, os);
    *os << "    Function call: " << Name();
    UniversalPrint(args, os);
  }